

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O3

void __thiscall l2r_lr_fun::Hv(l2r_lr_fun *this,double *s,double *Hs)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  Reduce_Vectors *this_00;
  double **ppdVar5;
  feature_node **ppfVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  feature_node *pfVar13;
  int iVar14;
  feature_node *pfVar15;
  int iVar16;
  double dVar17;
  
  uVar3 = this->prob->l;
  uVar10 = (*(this->super_function)._vptr_function[3])();
  this_00 = this->reduce_vectors;
  iVar14 = this_00->size;
  if (0 < (long)iVar14) {
    uVar4 = this_00->nr_thread;
    ppdVar5 = this_00->tmp_array;
    lVar11 = 0;
    do {
      if (0 < (int)uVar4) {
        uVar12 = 0;
        do {
          ppdVar5[uVar12][lVar11] = 0.0;
          uVar12 = uVar12 + 1;
        } while (uVar4 != uVar12);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != iVar14);
  }
  if (0 < (int)uVar3) {
    ppfVar6 = this->prob->x;
    pdVar7 = this->C;
    pdVar8 = this->D;
    uVar12 = 0;
    do {
      pfVar13 = ppfVar6[uVar12];
      iVar14 = pfVar13->index;
      if (iVar14 != -1) {
        pfVar13 = pfVar13 + 1;
        dVar17 = 0.0;
        pfVar15 = pfVar13;
        iVar16 = iVar14;
        do {
          dVar17 = dVar17 + s[(long)iVar16 + -1] * pfVar15[-1].value;
          iVar16 = pfVar15->index;
          pfVar15 = pfVar15 + 1;
        } while (iVar16 != -1);
        if (iVar14 != -1) {
          dVar1 = pdVar7[uVar12];
          dVar2 = pdVar8[uVar12];
          pdVar9 = this_00->tmp_array[1];
          do {
            pdVar9[(long)iVar14 + -1] =
                 pfVar13[-1].value * dVar1 * dVar2 * dVar17 + pdVar9[(long)iVar14 + -1];
            iVar14 = pfVar13->index;
            pfVar13 = pfVar13 + 1;
          } while (iVar14 != -1);
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar3);
  }
  Reduce_Vectors::reduce_sum(this_00,Hs);
  if (0 < (int)uVar10) {
    uVar12 = 0;
    do {
      Hs[uVar12] = s[uVar12] + Hs[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar10 != uVar12);
  }
  return;
}

Assistant:

void l2r_lr_fun::Hv(double *s, double *Hs)
{
	int i;
	int l=prob->l;
	int w_size=get_nr_variable();
	double *wa = new double[l];

	reduce_vectors->init();

#ifdef ENABLED_OPENMP
#pragma omp parallel for private(i) schedule(guided)
#endif
	for(i=0;i<l;i++)
	{
		feature_node *xi=prob->x[i];
		wa[i] = 0;
		while(xi->index != -1)
		{
			wa[i] += s[xi->index-1]*xi->value;
			xi++;
		}
		wa[i] = C[i]*D[i]*wa[i];
	
		reduce_vectors->sum_scale_x(wa[i], prob->x[i]);
	}

	reduce_vectors->reduce_sum(Hs);
	for(i=0;i<w_size;i++)
		Hs[i] = s[i] + Hs[i];
	delete[] wa;
}